

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

void arg_cat_optionv(char *dest,size_t ndest,char *shortopts,char *longopts,char *datatype,
                    int optvalue,char *separator)

{
  char *pcVar1;
  char *local_78;
  char *local_60;
  size_t ncspn;
  char *c_1;
  char *pcStack_40;
  char shortopt [3];
  char *c;
  int optvalue_local;
  char *datatype_local;
  char *longopts_local;
  char *shortopts_local;
  size_t ndest_local;
  char *dest_local;
  
  if (separator == (char *)0x0) {
    local_60 = "";
  }
  else {
    local_60 = separator;
  }
  pcVar1 = shortopts;
  shortopts_local = (char *)ndest;
  ndest_local = (size_t)dest;
  if (shortopts != (char *)0x0) {
    while (pcStack_40 = pcVar1, *pcStack_40 != '\0') {
      c_1._5_1_ = 0x2d;
      c_1._6_1_ = *pcStack_40;
      c_1._7_1_ = 0;
      arg_cat((char **)&ndest_local,(char *)((long)&c_1 + 5),(size_t *)&shortopts_local);
      pcVar1 = pcStack_40 + 1;
      if (pcStack_40[1] != '\0') {
        pcStack_40 = pcStack_40 + 1;
        arg_cat((char **)&ndest_local,local_60,(size_t *)&shortopts_local);
        pcVar1 = pcStack_40;
      }
    }
  }
  if ((shortopts != (char *)0x0) && (longopts != (char *)0x0)) {
    arg_cat((char **)&ndest_local,local_60,(size_t *)&shortopts_local);
  }
  ncspn = (size_t)longopts;
  if (longopts != (char *)0x0) {
    while (*(char *)ncspn != '\0') {
      arg_cat((char **)&ndest_local,"--",(size_t *)&shortopts_local);
      pcVar1 = (char *)strcspn((char *)ncspn,",");
      local_78 = pcVar1;
      if (shortopts_local <= pcVar1) {
        local_78 = shortopts_local;
      }
      strncat((char *)ndest_local,(char *)ncspn,(size_t)local_78);
      ncspn = (size_t)(pcVar1 + ncspn);
      if (*(char *)ncspn == ',') {
        arg_cat((char **)&ndest_local,local_60,(size_t *)&shortopts_local);
        ncspn = ncspn + 1;
      }
    }
  }
  if (datatype != (char *)0x0) {
    if (longopts == (char *)0x0) {
      if (shortopts != (char *)0x0) {
        arg_cat((char **)&ndest_local," ",(size_t *)&shortopts_local);
      }
    }
    else {
      arg_cat((char **)&ndest_local,"=",(size_t *)&shortopts_local);
    }
    if (optvalue == 0) {
      arg_cat((char **)&ndest_local,datatype,(size_t *)&shortopts_local);
    }
    else {
      arg_cat((char **)&ndest_local,"[",(size_t *)&shortopts_local);
      arg_cat((char **)&ndest_local,datatype,(size_t *)&shortopts_local);
      arg_cat((char **)&ndest_local,"]",(size_t *)&shortopts_local);
    }
  }
  return;
}

Assistant:

static void arg_cat_optionv(char* dest, size_t ndest, const char* shortopts, const char* longopts, const char* datatype, int optvalue, const char* separator) {
    separator = separator ? separator : "";

    if (shortopts) {
        const char* c = shortopts;
        while (*c) {
            /* "-a|-b|-c" */
            char shortopt[3];

            /* note: shortopt array[] is initialiazed dynamically here to satisfy */
            /* a deficiency in the watcom compiler wrt static array initializers. */
            shortopt[0] = '-';
            shortopt[1] = *c;
            shortopt[2] = 0;

            arg_cat(&dest, shortopt, &ndest);
            if (*++c)
                arg_cat(&dest, separator, &ndest);
        }
    }

    /* put separator between long opts and short opts */
    if (shortopts && longopts)
        arg_cat(&dest, separator, &ndest);

    if (longopts) {
        const char* c = longopts;
        while (*c) {
            size_t ncspn;

            /* add "--" tag prefix */
            arg_cat(&dest, "--", &ndest);

            /* add comma separated option tag */
            ncspn = strcspn(c, ",");
#if (defined(__STDC_LIB_EXT1__) && defined(__STDC_WANT_LIB_EXT1__)) || (defined(__STDC_SECURE_LIB__) && defined(__STDC_WANT_SECURE_LIB__))
            strncat_s(dest, ndest, c, (ncspn < ndest) ? ncspn : ndest);
#else
            strncat(dest, c, (ncspn < ndest) ? ncspn : ndest);
#endif
            c += ncspn;

            /* add given separator in place of comma */
            if (*c == ',') {
                arg_cat(&dest, separator, &ndest);
                c++;
            }
        }
    }

    if (datatype) {
        if (longopts)
            arg_cat(&dest, "=", &ndest);
        else if (shortopts)
            arg_cat(&dest, " ", &ndest);

        if (optvalue) {
            arg_cat(&dest, "[", &ndest);
            arg_cat(&dest, datatype, &ndest);
            arg_cat(&dest, "]", &ndest);
        } else
            arg_cat(&dest, datatype, &ndest);
    }
}